

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<char,_std::allocator<char>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<char>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *opt,
          typed_value<std::vector<char,_std::allocator<char>_>,_char> *po_value)

{
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *ptVar1;
  function1<void,_const_std::vector<char,_std::allocator<char>_>_&> *in_stack_ffffffffffffff88;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *in_stack_ffffffffffffff90;
  type_conflict1 in_stack_ffffffffffffffc4;
  functor_type_conflict3 *in_stack_ffffffffffffffc8;
  function1<void,_const_std::vector<char,_std::allocator<char>_>_&> *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>::shared_ptr
            ((shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
             in_stack_ffffffffffffff90,
             (shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
             in_stack_ffffffffffffff88);
  boost::function1<void,std::vector<char,std::allocator<char>>const&>::
  function1<VW::config::options_boost_po::add_notifier<char>(std::shared_ptr<VW::config::typed_option<std::vector<char,std::allocator<char>>>>&,boost::program_options::typed_value<std::vector<char,std::allocator<char>>,char>*)::_lambda(std::vector<char,std::allocator<char>>)_1_>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  ptVar1 = boost::program_options::typed_value<std::vector<char,_std::allocator<char>_>,_char>::
           notifier(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  boost::function1<void,_const_std::vector<char,_std::allocator<char>_>_&>::~function1
            ((function1<void,_const_std::vector<char,_std::allocator<char>_>_&> *)0x160914);
  add_notifier<char>(std::shared_ptr<VW::config::typed_option<std::vector<char,std::allocator<char>>>>&,boost::program_options::typed_value<std::vector<char,std::allocator<char>>,char>*)
  ::{lambda(std::vector<char,std::allocator<char>>)#1}::~shared_ptr
            ((functor_type_conflict3 *)0x16091e);
  return ptVar1;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<std::vector<T>>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([opt](std::vector<T> final_arguments) {
    // Set the value for the listening location.
    opt->m_location = final_arguments;
    opt->value(final_arguments);
  });
}